

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_aea87::AssertionEmitter::fixCalls
          (AssertionEmitter *this,Ref asmjs,Name asmModule)

{
  Value *this_00;
  int iVar1;
  ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref> *this_01;
  Ref *pRVar2;
  IString *pIVar3;
  long lVar4;
  Ref RVar5;
  ArrayStorage *pAVar6;
  ArrayStorage *pAVar7;
  char *extraout_RDX;
  ArrayStorage *__range2;
  IString name;
  Name asmModule_00;
  Name asmModule_01;
  Name asmModule_02;
  Name asmModule_03;
  IString key;
  IString local_78;
  IString local_68;
  IString local_58;
  AssertionEmitter *local_48;
  undefined1 local_40 [8];
  Iterator __begin2;
  
  pAVar7 = asmModule.super_IString.str._M_str;
  asmModule_00.super_IString.str._M_len = asmModule.super_IString.str._M_len;
  iVar1 = *(int *)&this->script;
  if (iVar1 == 2) {
    local_48 = this;
    this_01 = &cashew::Value::getArray((Value *)this)->
               super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>;
    __begin2.parent = (ArrayStorage *)0x0;
    pAVar7 = (ArrayStorage *)this_01->usedElements;
    local_40 = (undefined1  [8])this_01;
    while ((__begin2.parent != pAVar7 || (local_40 != (undefined1  [8])this_01))) {
      pAVar6 = __begin2.parent;
      pRVar2 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::Iterator::operator*
                         ((Iterator *)local_40);
      asmModule_00.super_IString.str._M_str = (char *)pAVar6;
      fixCalls((AssertionEmitter *)pRVar2->inst,asmjs,asmModule_00);
      __begin2.parent =
           (ArrayStorage *)
           ((long)&((__begin2.parent)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).
                   data + 1);
    }
    pAVar7 = __begin2.parent;
    if (this_01->usedElements != 0) {
      pRVar2 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::operator[](this_01,0);
      if (pRVar2->inst->type == String) {
        pRVar2 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::operator[](this_01,0);
        pIVar3 = cashew::Value::getIString(pRVar2->inst);
        pAVar7 = (ArrayStorage *)&cashew::CALL;
        if ((pIVar3->str)._M_str == cashew::DIV) {
          if (this_01->usedElements < 2) {
            __assert_fail("arr.size() >= 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm2js.cpp"
                          ,0x2d0,"void (anonymous namespace)::AssertionEmitter::fixCalls(Ref, Name)"
                         );
          }
          pRVar2 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::operator[](this_01,1);
          pIVar3 = cashew::Value::getIString(pRVar2->inst);
          ::wasm::IString::IString((IString *)local_40,"f32Equal");
          if ((ArrayStorage *)(pIVar3->str)._M_str != __begin2.parent) {
            pRVar2 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::operator[](this_01,1);
            pIVar3 = cashew::Value::getIString(pRVar2->inst);
            ::wasm::IString::IString(&local_78,"f64Equal");
            if ((pIVar3->str)._M_str != local_78.str._M_str) {
              pRVar2 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::operator[](this_01,1);
              pIVar3 = cashew::Value::getIString(pRVar2->inst);
              ::wasm::IString::IString(&local_68,"i64Equal");
              if ((pIVar3->str)._M_str != local_68.str._M_str) {
                pRVar2 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::operator[](this_01,1);
                pIVar3 = cashew::Value::getIString(pRVar2->inst);
                ::wasm::IString::IString(&local_58,"isNaN");
                if ((pIVar3->str)._M_str != local_58.str._M_str) {
                  pRVar2 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::operator[](this_01,1)
                  ;
                  pIVar3 = cashew::Value::getIString(pRVar2->inst);
                  ::wasm::IString::IString((IString *)local_40,"Math_fround");
                  if ((ArrayStorage *)(pIVar3->str)._M_str == __begin2.parent) {
                    pRVar2 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::operator[]
                                       (this_01,1);
                    cashew::Value::setString(pRVar2->inst,"Math.fround");
                  }
                  else {
                    name.str._M_str = extraout_RDX;
                    name.str._M_len = asmModule_00.super_IString.str._M_len;
                    RVar5 = cashew::ValueBuilder::makeName(asmjs.inst,name);
                    pRVar2 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::operator[]
                                       (this_01,1);
                    pIVar3 = cashew::Value::getIString(pRVar2->inst);
                    key.str._M_str = (char *)pAVar7;
                    key.str._M_len = (size_t)(pIVar3->str)._M_str;
                    RVar5 = cashew::ValueBuilder::makeDot
                                      (RVar5.inst,(Value *)(pIVar3->str)._M_len,key);
                    pRVar2 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::operator[]
                                       (this_01,1);
                    this_00 = pRVar2->inst;
                    pAVar6 = cashew::Value::getArray(RVar5.inst);
                    cashew::Value::setArray(this_00,pAVar6);
                  }
                }
              }
            }
          }
        }
      }
    }
    iVar1 = *(int *)&local_48->script;
    this = local_48;
  }
  if (iVar1 == 6) {
    lVar4 = cashew::Value::asAssign();
    asmModule_01.super_IString.str._M_str = (char *)pAVar7;
    asmModule_01.super_IString.str._M_len = asmModule_00.super_IString.str._M_len;
    fixCalls(*(AssertionEmitter **)(lVar4 + 8),asmjs,asmModule_01);
    lVar4 = cashew::Value::asAssign();
    asmModule_02.super_IString.str._M_str = (char *)pAVar7;
    asmModule_02.super_IString.str._M_len = asmModule_00.super_IString.str._M_len;
    fixCalls(*(AssertionEmitter **)(lVar4 + 0x18),asmjs,asmModule_02);
    iVar1 = *(int *)&this->script;
  }
  if (iVar1 == 7) {
    lVar4 = cashew::Value::asAssignName();
    asmModule_03.super_IString.str._M_str = (char *)pAVar7;
    asmModule_03.super_IString.str._M_len = asmModule_00.super_IString.str._M_len;
    fixCalls(*(AssertionEmitter **)(lVar4 + 8),asmjs,asmModule_03);
  }
  return;
}

Assistant:

void AssertionEmitter::fixCalls(Ref asmjs, Name asmModule) {
  if (asmjs->isArray()) {
    ArrayStorage& arr = asmjs->getArray();
    for (Ref& r : arr) {
      fixCalls(r, asmModule);
    }
    if (arr.size() > 0 && arr[0]->isString() &&
        arr[0]->getIString() == cashew::CALL) {
      assert(arr.size() >= 2);
      if (arr[1]->getIString() == "f32Equal" ||
          arr[1]->getIString() == "f64Equal" ||
          arr[1]->getIString() == "i64Equal" ||
          arr[1]->getIString() == "isNaN") {
        // ...
      } else if (arr[1]->getIString() == "Math_fround") {
        arr[1]->setString("Math.fround");
      } else {
        Ref fixed = ValueBuilder::makeDot(ValueBuilder::makeName(asmModule),
                                          arr[1]->getIString());
        arr[1]->setArray(fixed->getArray());
      }
    }
  }

  if (asmjs->isAssign()) {
    fixCalls(asmjs->asAssign()->target(), asmModule);
    fixCalls(asmjs->asAssign()->value(), asmModule);
  }
  if (asmjs->isAssignName()) {
    fixCalls(asmjs->asAssignName()->value(), asmModule);
  }
}